

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

_Bool cpu_physical_memory_rw_ppc64(AddressSpace *as,hwaddr addr,void *buf,hwaddr len,_Bool is_write)

{
  MemTxResult MVar1;
  uint local_3c;
  MemTxResult result;
  _Bool is_write_local;
  hwaddr len_local;
  void *buf_local;
  hwaddr addr_local;
  AddressSpace *as_local;
  
  MVar1 = address_space_rw_ppc64(as,addr,(MemTxAttrs)(local_3c & 0xff800000 | 1),buf,len,is_write);
  return MVar1 == 0;
}

Assistant:

bool cpu_physical_memory_rw(AddressSpace *as, hwaddr addr, void *buf,
                            hwaddr len, bool is_write)
{
    MemTxResult result = address_space_rw(as, addr, MEMTXATTRS_UNSPECIFIED,
                     buf, len, is_write);
    if (result == MEMTX_OK) {
        return true;
    } else {
        return false;
    }
}